

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send_file_internal
               (mg_connection *c,char *file_name,file_stat_t *st,int exists,char *extra_headers)

{
  char *pcVar1;
  char *s1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  char *dir_lst;
  char *cgi_pat;
  char local_2038 [4];
  int is_directory;
  char path [8192];
  connection *conn;
  char *extra_headers_local;
  int exists_local;
  file_stat_t *st_local;
  char *file_name_local;
  mg_connection *c_local;
  
  path._8184_8_ = &c[-1].callback_param;
  bVar5 = (st->st_mode & 0xf000) != 0x4000;
  pcVar1 = *(char **)(c[1].request_method + 0x58);
  s1 = *(char **)(c[1].request_method + 0x70);
  mg_snprintf(local_2038,0x2000,"%s",file_name);
  if ((exists == 0) || (iVar3 = must_hide_file((connection *)path._8184_8_,local_2038), iVar3 != 0))
  {
    send_http_error((connection *)path._8184_8_,0x194,(char *)0x0);
  }
  else if ((bVar5) ||
          (lVar2 = *(long *)(path._8184_8_ + 0x10), sVar4 = strlen(*(char **)(path._8184_8_ + 0x10))
          , *(char *)(lVar2 + (sVar4 - 1)) == '/')) {
    if ((bVar5) ||
       (iVar3 = find_index_file((connection *)path._8184_8_,local_2038,0x2000,st), iVar3 != 0)) {
      sVar4 = strlen(pcVar1);
      iVar3 = mg_match_prefix(pcVar1,(int)sVar4,local_2038);
      if (iVar3 < 1) {
        pcVar1 = *(char **)(*(long *)(path._8184_8_ + 0x2a8) + 0xb8);
        sVar4 = strlen(*(char **)(*(long *)(path._8184_8_ + 0x2a8) + 0xb8));
        iVar3 = mg_match_prefix(pcVar1,(int)sVar4,local_2038);
        if (iVar3 < 1) {
          iVar3 = is_not_modified((connection *)path._8184_8_,st);
          if (iVar3 == 0) {
            iVar3 = open64(local_2038,0);
            *(int *)(path._8184_8_ + 0x2b0) = iVar3;
            if (iVar3 == -1) {
              send_http_error((connection *)path._8184_8_,0x194,(char *)0x0);
            }
            else {
              open_file_endpoint((connection *)path._8184_8_,local_2038,st,extra_headers);
            }
          }
          else {
            send_http_error((connection *)path._8184_8_,0x130,(char *)0x0);
          }
        }
        else {
          handle_ssi_request((connection *)path._8184_8_,local_2038);
        }
      }
      else {
        open_cgi_endpoint((connection *)path._8184_8_,local_2038);
      }
    }
    else {
      iVar3 = mg_strcasecmp(s1,"yes");
      if (iVar3 == 0) {
        send_directory_listing((connection *)path._8184_8_,local_2038);
      }
      else {
        send_http_error((connection *)path._8184_8_,0x193,(char *)0x0);
      }
    }
  }
  else {
    *(undefined4 *)(path._8184_8_ + 0x284) = 0x12d;
    mg_printf((mg_connection *)(path._8184_8_ + 8),
              "HTTP/1.1 301 Moved Permanently\r\nLocation: %s/\r\n\r\n",
              *(undefined8 *)(path._8184_8_ + 0x10));
    close_local_endpoint((connection *)path._8184_8_);
  }
  return;
}

Assistant:

void mg_send_file_internal(struct mg_connection *c, const char *file_name,
                           file_stat_t *st, int exists,
                           const char *extra_headers) {
  struct connection *conn = MG_CONN_2_CONN(c);
  char path[MAX_PATH_SIZE];
  const int is_directory = S_ISDIR(st->st_mode);
#ifndef MONGOOSE_NO_CGI
  const char *cgi_pat = conn->server->config_options[CGI_PATTERN];
#else
  const char *cgi_pat = DEFAULT_CGI_PATTERN;
#endif
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
  const char *dir_lst = conn->server->config_options[ENABLE_DIRECTORY_LISTING];
#else
  const char *dir_lst = "yes";
#endif

  mg_snprintf(path, sizeof(path), "%s", file_name);

  if (!exists || must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (is_directory &&
             conn->mg_conn.uri[strlen(conn->mg_conn.uri) - 1] != '/') {
    conn->mg_conn.status_code = 301;
    mg_printf(&conn->mg_conn, "HTTP/1.1 301 Moved Permanently\r\n"
              "Location: %s/\r\n\r\n", conn->mg_conn.uri);
    close_local_endpoint(conn);
  } else if (is_directory && !find_index_file(conn, path, sizeof(path), st)) {
    if (!mg_strcasecmp(dir_lst, "yes")) {
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
      send_directory_listing(conn, path);
#else
      send_http_error(conn, 501, NULL);
#endif
    } else {
      send_http_error(conn, 403, NULL);
    }
  } else if (mg_match_prefix(cgi_pat, strlen(cgi_pat), path) > 0) {
#if !defined(MONGOOSE_NO_CGI)
    open_cgi_endpoint(conn, path);
#else
    send_http_error(conn, 501, NULL);
#endif // !MONGOOSE_NO_CGI
#ifndef MONGOOSE_NO_SSI
  } else if (mg_match_prefix(conn->server->config_options[SSI_PATTERN],
                             strlen(conn->server->config_options[SSI_PATTERN]),
                             path) > 0) {
    handle_ssi_request(conn, path);
#endif
  } else if (is_not_modified(conn, st)) {
    send_http_error(conn, 304, NULL);
  } else if ((conn->endpoint.fd = open(path, O_RDONLY | O_BINARY, 0)) != -1) {
    // O_BINARY is required for Windows, otherwise in default text mode
    // two bytes \r\n will be read as one.
    open_file_endpoint(conn, path, st, extra_headers);
  } else {
    send_http_error(conn, 404, NULL);
  }
}